

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_index_tests.cpp
# Opt level: O0

bool blockfilter_index_tests::CheckFilterLookups
               (BlockFilterIndex *filter_index,CBlockIndex *block_index,uint256 *last_header,
               BlockManager *blockman)

{
  bool bVar1;
  undefined8 *in_RDX;
  long in_FS_OFFSET;
  vector<uint256,_std::allocator<uint256>_> filter_hashes;
  vector<BlockFilter,_std::allocator<BlockFilter>_> filters;
  uint256 filter_header;
  BlockFilter filter;
  BlockFilter expected_filter;
  char *in_stack_fffffffffffff8a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[31],_const_char_(&)[31]>
  *in_stack_fffffffffffff8b0;
  char *in_stack_fffffffffffff8b8;
  CBlockIndex *in_stack_fffffffffffff8c0;
  undefined7 in_stack_fffffffffffff8c8;
  undefined1 in_stack_fffffffffffff8cf;
  const_string *in_stack_fffffffffffff8d0;
  BlockManager *in_stack_fffffffffffff8d8;
  const_string *line_num;
  BlockFilter *in_stack_fffffffffffff8e0;
  const_string *file;
  CBlockIndex *in_stack_fffffffffffff8e8;
  const_string *this;
  vector<uint256,_std::allocator<uint256>_> *in_stack_fffffffffffff8f0;
  CBlockIndex *in_stack_fffffffffffff8f8;
  undefined8 in_stack_fffffffffffff900;
  BlockFilterIndex *in_stack_fffffffffffff908;
  undefined7 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff917;
  BlockFilterIndex *in_stack_fffffffffffff918;
  BlockFilterIndex *in_stack_fffffffffffff920;
  bool local_651;
  undefined1 local_650 [8];
  undefined1 local_600 [16];
  undefined1 local_5f0 [48];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [64];
  undefined1 local_560 [16];
  undefined1 local_550 [68];
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[31],_const_char_(&)[31]> local_50c [3];
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[31],_const_char_(&)[31]> local_4ac [2];
  const_string local_450 [2];
  lazy_ostream local_430 [2];
  assertion_result local_410 [2];
  const_string local_3d8 [2];
  lazy_ostream local_3b8 [2];
  assertion_result local_398 [2];
  const_string local_360 [2];
  lazy_ostream local_340 [2];
  assertion_result local_320 [2];
  const_string local_2e8 [2];
  lazy_ostream local_2c8 [2];
  assertion_result local_2a8 [4];
  const_string local_240 [3];
  lazy_ostream local_210 [2];
  assertion_result local_1f0 [2];
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[31],_const_char_(&)[31]> local_1b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[31],_const_char_(&)[31]> local_198;
  undefined1 local_178 [32];
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[31],_const_char_(&)[31]> local_158;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[31],_const_char_(&)[31]> local_138;
  undefined1 local_118 [32];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  BlockFilter::BlockFilter((BlockFilter *)in_stack_fffffffffffff8c0);
  BlockFilterIndex::GetFilterType((BlockFilterIndex *)in_stack_fffffffffffff8a8);
  bVar1 = ComputeFilter((BlockFilterType)((ulong)in_stack_fffffffffffff8f0 >> 0x30),
                        in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                        in_stack_fffffffffffff8d8);
  if (bVar1) {
    BlockFilter::BlockFilter((BlockFilter *)in_stack_fffffffffffff8c0);
    uint256::uint256((uint256 *)in_stack_fffffffffffff8a8);
    std::vector<BlockFilter,_std::allocator<BlockFilter>_>::vector
              ((vector<BlockFilter,_std::allocator<BlockFilter>_> *)in_stack_fffffffffffff8a8);
    std::vector<uint256,_std::allocator<uint256>_>::vector
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff8a8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff8e8,
                 (const_string *)in_stack_fffffffffffff8e0,(size_t)in_stack_fffffffffffff8d8,
                 in_stack_fffffffffffff8d0);
      BlockFilterIndex::LookupFilter
                ((BlockFilterIndex *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                 in_stack_fffffffffffff8c0,(BlockFilter *)in_stack_fffffffffffff8b8);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff8b8,
                 SUB81((ulong)in_stack_fffffffffffff8b0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      boost::unit_test::operator<<
                (&in_stack_fffffffffffff8b0->super_lazy_ostream,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      in_stack_fffffffffffff8a8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2a8,local_2c8,local_2e8,0x2e,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff8a8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff8a8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff8e8,
                 (const_string *)in_stack_fffffffffffff8e0,(size_t)in_stack_fffffffffffff8d8,
                 in_stack_fffffffffffff8d0);
      BlockFilterIndex::LookupFilterHeader
                (in_stack_fffffffffffff918,
                 (CBlockIndex *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                 (uint256 *)in_stack_fffffffffffff908);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff8b8,
                 SUB81((ulong)in_stack_fffffffffffff8b0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      boost::unit_test::operator<<
                (&in_stack_fffffffffffff8b0->super_lazy_ostream,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      in_stack_fffffffffffff8a8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_320,local_340,local_360,0x2f,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff8a8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff8a8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff8e8,
                 (const_string *)in_stack_fffffffffffff8e0,(size_t)in_stack_fffffffffffff8d8,
                 in_stack_fffffffffffff8d0);
      BlockFilterIndex::LookupFilterRange
                (in_stack_fffffffffffff920,(int)((ulong)in_stack_fffffffffffff918 >> 0x20),
                 (CBlockIndex *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                 (vector<BlockFilter,_std::allocator<BlockFilter>_> *)in_stack_fffffffffffff908);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff8b8,
                 SUB81((ulong)in_stack_fffffffffffff8b0 >> 0x38,0));
      in_stack_fffffffffffff920 = (BlockFilterIndex *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      boost::unit_test::operator<<
                (&in_stack_fffffffffffff8b0->super_lazy_ostream,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      in_stack_fffffffffffff8a8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_398,local_3b8,local_3d8,0x30,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff8a8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff8a8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff8e8,
                 (const_string *)in_stack_fffffffffffff8e0,(size_t)in_stack_fffffffffffff8d8,
                 in_stack_fffffffffffff8d0);
      BlockFilterIndex::LookupFilterHashRange
                (in_stack_fffffffffffff908,(int)((ulong)in_stack_fffffffffffff900 >> 0x20),
                 in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff8b8,
                 SUB81((ulong)in_stack_fffffffffffff8b0 >> 0x38,0));
      in_stack_fffffffffffff908 = (BlockFilterIndex *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      boost::unit_test::operator<<
                (&in_stack_fffffffffffff8b0->super_lazy_ostream,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      in_stack_fffffffffffff8a8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_410,local_430,local_450,0x32,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff8a8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff8a8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff8e8,
                 (const_string *)in_stack_fffffffffffff8e0,(size_t)in_stack_fffffffffffff8d8,
                 in_stack_fffffffffffff8d0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&in_stack_fffffffffffff8b0->super_lazy_ostream,
                 (char (*) [1])in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      local_4ac[0].super_lazy_ostream._4_8_ =
           std::vector<BlockFilter,_std::allocator<BlockFilter>_>::size
                     ((vector<BlockFilter,_std::allocator<BlockFilter>_> *)in_stack_fffffffffffff8a8
                     );
      local_4ac[0].super_lazy_ostream._vptr_lazy_ostream._0_4_ = 1;
      in_stack_fffffffffffff8b8 = "1U";
      in_stack_fffffffffffff8b0 = local_4ac;
      in_stack_fffffffffffff8a8 = "filters.size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                ((undefined1 *)((long)&local_4ac[0].m_value + 4),
                 &local_4ac[0].super_lazy_ostream.field_0xc,0x34,1,2,
                 (undefined1 *)((long)&local_4ac[0].super_lazy_ostream._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff8a8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff8e8,
                 (const_string *)in_stack_fffffffffffff8e0,(size_t)in_stack_fffffffffffff8d8,
                 in_stack_fffffffffffff8d0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&in_stack_fffffffffffff8b0->super_lazy_ostream,
                 (char (*) [1])in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      local_50c[0].super_lazy_ostream._4_8_ =
           std::vector<uint256,_std::allocator<uint256>_>::size
                     ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff8a8);
      local_50c[0].super_lazy_ostream._vptr_lazy_ostream._0_4_ = 1;
      in_stack_fffffffffffff8b8 = "1U";
      in_stack_fffffffffffff8b0 = local_50c;
      in_stack_fffffffffffff8a8 = "filter_hashes.size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                ((undefined1 *)((long)&local_50c[0].m_value + 4),
                 &local_50c[0].super_lazy_ostream.field_0xc,0x35,1,2,
                 (undefined1 *)((long)&local_50c[0].super_lazy_ostream._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff8a8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff8e8,
                 (const_string *)in_stack_fffffffffffff8e0,(size_t)in_stack_fffffffffffff8d8,
                 in_stack_fffffffffffff8d0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&in_stack_fffffffffffff8b0->super_lazy_ostream,
                 (char (*) [1])in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      BlockFilter::GetHash((BlockFilter *)in_stack_fffffffffffff8b8);
      BlockFilter::GetHash((BlockFilter *)in_stack_fffffffffffff8b8);
      in_stack_fffffffffffff8b8 = "expected_filter.GetHash()";
      in_stack_fffffffffffff8b0 = &local_138;
      in_stack_fffffffffffff8a8 = "filter.GetHash()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                (local_550,local_560,0x37,1,2,local_118);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff8a8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      this = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)this,(const_string *)in_stack_fffffffffffff8e0,
                 (size_t)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&in_stack_fffffffffffff8b0->super_lazy_ostream,
                 (char (*) [1])in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      BlockFilter::ComputeHeader
                ((BlockFilter *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                 (uint256 *)in_stack_fffffffffffff8c0);
      in_stack_fffffffffffff8b8 = "expected_filter.ComputeHeader(last_header)";
      in_stack_fffffffffffff8b0 = &local_158;
      in_stack_fffffffffffff8a8 = "filter_header";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                (local_5a0,local_5b0,0x38,1,2,&local_f8);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff8a8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      file = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)this,file,(size_t)in_stack_fffffffffffff8d8,
                 in_stack_fffffffffffff8d0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&in_stack_fffffffffffff8b0->super_lazy_ostream,
                 (char (*) [1])in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      std::vector<BlockFilter,_std::allocator<BlockFilter>_>::operator[]
                ((vector<BlockFilter,_std::allocator<BlockFilter>_> *)in_stack_fffffffffffff8b8,
                 (size_type)in_stack_fffffffffffff8b0);
      BlockFilter::GetHash((BlockFilter *)in_stack_fffffffffffff8b8);
      BlockFilter::GetHash((BlockFilter *)in_stack_fffffffffffff8b8);
      in_stack_fffffffffffff8b8 = "expected_filter.GetHash()";
      in_stack_fffffffffffff8b0 = &local_198;
      in_stack_fffffffffffff8a8 = "filters[0].GetHash()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                (local_5f0,local_600,0x39,1,2,local_178);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff8a8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)this,file,(size_t)line_num,in_stack_fffffffffffff8d0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&in_stack_fffffffffffff8b0->super_lazy_ostream,
                 (char (*) [1])in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      in_stack_fffffffffffff8d0 =
           (const_string *)
           std::vector<uint256,_std::allocator<uint256>_>::operator[]
                     ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff8b8,
                      (size_type)in_stack_fffffffffffff8b0);
      BlockFilter::GetHash((BlockFilter *)in_stack_fffffffffffff8b8);
      in_stack_fffffffffffff8b8 = "expected_filter.GetHash()";
      in_stack_fffffffffffff8b0 = &local_1b8;
      in_stack_fffffffffffff8a8 = "filter_hashes[0]";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                (&stack0xfffffffffffff9c0,local_650,0x3a,1,2,in_stack_fffffffffffff8d0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff8a8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::vector<BlockFilter,_std::allocator<BlockFilter>_>::clear
              ((vector<BlockFilter,_std::allocator<BlockFilter>_> *)in_stack_fffffffffffff8a8);
    std::vector<uint256,_std::allocator<uint256>_>::clear
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff8a8);
    *in_RDX = local_f8;
    in_RDX[1] = local_f0;
    in_RDX[2] = local_e8;
    in_RDX[3] = local_e0;
    local_651 = true;
    std::vector<uint256,_std::allocator<uint256>_>::~vector
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff8b8);
    std::vector<BlockFilter,_std::allocator<BlockFilter>_>::~vector
              ((vector<BlockFilter,_std::allocator<BlockFilter>_> *)in_stack_fffffffffffff8b8);
    BlockFilter::~BlockFilter((BlockFilter *)in_stack_fffffffffffff8a8);
  }
  else {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff8e8,
                 (const_string *)in_stack_fffffffffffff8e0,(size_t)in_stack_fffffffffffff8d8,
                 in_stack_fffffffffffff8d0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff8b8,
                 SUB81((ulong)in_stack_fffffffffffff8b0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&in_stack_fffffffffffff8b0->super_lazy_ostream,
                 (char (*) [31])in_stack_fffffffffffff8a8);
      boost::unit_test::operator<<(in_stack_fffffffffffff8b0,(int *)in_stack_fffffffffffff8a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff8b8,
                 (pointer)in_stack_fffffffffffff8b0,(unsigned_long)in_stack_fffffffffffff8a8);
      in_stack_fffffffffffff8a8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1f0,local_210,local_240,0x25,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[31],_const_char_(&)[31]>,_int,_const_int_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[31],_const_char_(&)[31]>,_int,_const_int_&>
                  *)in_stack_fffffffffffff8a8);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[31],_const_char_(&)[31]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[31],_const_char_(&)[31]>
                          *)in_stack_fffffffffffff8a8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff8a8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    local_651 = false;
  }
  BlockFilter::~BlockFilter((BlockFilter *)in_stack_fffffffffffff8a8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_651;
}

Assistant:

static bool CheckFilterLookups(BlockFilterIndex& filter_index, const CBlockIndex* block_index,
                               uint256& last_header, const BlockManager& blockman)
{
    BlockFilter expected_filter;
    if (!ComputeFilter(filter_index.GetFilterType(), *block_index, expected_filter, blockman)) {
        BOOST_ERROR("ComputeFilter failed on block " << block_index->nHeight);
        return false;
    }

    BlockFilter filter;
    uint256 filter_header;
    std::vector<BlockFilter> filters;
    std::vector<uint256> filter_hashes;

    BOOST_CHECK(filter_index.LookupFilter(block_index, filter));
    BOOST_CHECK(filter_index.LookupFilterHeader(block_index, filter_header));
    BOOST_CHECK(filter_index.LookupFilterRange(block_index->nHeight, block_index, filters));
    BOOST_CHECK(filter_index.LookupFilterHashRange(block_index->nHeight, block_index,
                                                   filter_hashes));

    BOOST_CHECK_EQUAL(filters.size(), 1U);
    BOOST_CHECK_EQUAL(filter_hashes.size(), 1U);

    BOOST_CHECK_EQUAL(filter.GetHash(), expected_filter.GetHash());
    BOOST_CHECK_EQUAL(filter_header, expected_filter.ComputeHeader(last_header));
    BOOST_CHECK_EQUAL(filters[0].GetHash(), expected_filter.GetHash());
    BOOST_CHECK_EQUAL(filter_hashes[0], expected_filter.GetHash());

    filters.clear();
    filter_hashes.clear();
    last_header = filter_header;
    return true;
}